

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_sum.c
# Opt level: O1

int main(int argc,char **argv)

{
  mbedtls_md_type_t md_type;
  uchar uVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  mbedtls_md_type_t *pmVar7;
  mbedtls_md_info_t *pmVar8;
  char *pcVar9;
  FILE *__stream;
  size_t sVar10;
  char *pcVar11;
  size_t sVar12;
  byte *__s;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  mbedtls_md_context_t md_ctx;
  uchar sum [64];
  char buf [129];
  char line [1024];
  ulong local_530;
  mbedtls_md_context_t local_520;
  byte local_508 [64];
  byte local_4c8 [143];
  char acStack_439 [67];
  undefined1 local_3f6 [966];
  
  mbedtls_md_init(&local_520);
  if (argc == 1) {
    puts("print mode:  generic_sum <mbedtls_md> <file> <file> ...");
    puts("check mode:  generic_sum <mbedtls_md> -c <checksum file>");
    puts("\nAvailable message digests:");
    pmVar7 = (mbedtls_md_type_t *)mbedtls_md_list();
    md_type = *pmVar7;
    while (md_type != MBEDTLS_MD_NONE) {
      pmVar7 = pmVar7 + 1;
      pmVar8 = mbedtls_md_info_from_type(md_type);
      pcVar9 = mbedtls_md_get_name(pmVar8);
      printf("  %s\n",pcVar9);
      md_type = *pmVar7;
    }
  }
  else {
    pmVar8 = mbedtls_md_info_from_string(argv[1]);
    if (pmVar8 == (mbedtls_md_info_t *)0x0) {
      main_cold_2();
    }
    else {
      iVar4 = mbedtls_md_setup(&local_520,pmVar8,0);
      if (iVar4 == 0) {
        if ((argc == 4) && (iVar4 = strcmp("-c",argv[2]), iVar4 == 0)) {
          pcVar9 = argv[3];
          __stream = fopen(pcVar9,"rb");
          if (__stream == (FILE *)0x0) {
            printf("failed to open: %s\n",pcVar9);
            uVar14 = 1;
          }
          else {
            uVar6 = 0;
            memset(acStack_439 + 1,0,0x400);
            pcVar9 = fgets(acStack_439 + 1,0x3ff,__stream);
            uVar15 = 0;
            local_530 = 0;
            uVar14 = 0;
            if (pcVar9 != (char *)0x0) {
              pcVar9 = acStack_439 + 1;
              uVar14 = 0;
              local_530 = 0;
              uVar15 = 0;
              uVar6 = 0;
              do {
                while( true ) {
                  sVar10 = strlen(pcVar9);
                  bVar2 = mbedtls_md_get_size(pmVar8);
                  if ((((ulong)bVar2 * 2 + 4 <= sVar10) &&
                      (bVar2 = mbedtls_md_get_size(pmVar8), acStack_439[(ulong)bVar2 * 2 + 1] == ' '
                      )) && (bVar2 = mbedtls_md_get_size(pmVar8),
                            acStack_439[(ulong)bVar2 * 2 + 2] == ' ')) break;
                  pcVar11 = mbedtls_md_get_name(pmVar8);
                  printf("No \'%s\' hash found on line.\n",pcVar11);
                  pcVar11 = fgets(pcVar9,(int)sVar10 + -1,__stream);
joined_r0x001036bf:
                  if (pcVar11 == (char *)0x0) goto LAB_001036cf;
                }
                sVar12 = sVar10;
                if (acStack_439[sVar10] == '\n') {
                  sVar12 = sVar10 - 1;
                  acStack_439[sVar10] = '\0';
                }
                sVar10 = sVar12;
                if (acStack_439[sVar12] == '\r') {
                  sVar10 = sVar12 - 1;
                  acStack_439[sVar12] = '\0';
                }
                uVar5 = (int)local_530 + 1;
                local_530 = (ulong)uVar5;
                bVar2 = mbedtls_md_get_size(pmVar8);
                iVar4 = generic_wrapper(pmVar8,acStack_439 + (ulong)bVar2 * 2 + 3,local_508);
                if (iVar4 != 0) {
                  uVar6 = uVar6 + 1;
                  pcVar11 = fgets(pcVar9,(int)sVar10 + -1,__stream);
                  local_530 = (ulong)uVar5;
                  goto joined_r0x001036bf;
                }
                uVar1 = mbedtls_md_get_size(pmVar8);
                if (uVar1 != '\0') {
                  __s = local_4c8;
                  uVar16 = 0;
                  do {
                    sprintf((char *)__s,"%02x",(ulong)local_508[uVar16]);
                    uVar16 = uVar16 + 1;
                    bVar2 = mbedtls_md_get_size(pmVar8);
                    __s = __s + 2;
                  } while (uVar16 < bVar2);
                }
                uVar1 = mbedtls_md_get_size(pmVar8);
                if (uVar1 != '\0') {
                  uVar16 = 0;
                  bVar2 = 0;
                  do {
                    bVar2 = bVar2 | local_4c8[uVar16] ^ acStack_439[uVar16 + 1];
                    uVar16 = uVar16 + 1;
                    bVar3 = mbedtls_md_get_size(pmVar8);
                  } while (uVar16 < (uint)bVar3 * 2);
                  if (bVar2 != 0) {
                    uVar15 = uVar15 + 1;
                    fprintf(_stderr,"wrong checksum: %s\n",local_3f6);
                  }
                }
                uVar14 = uVar14 + 1;
                pcVar11 = fgets(pcVar9,0x3ff,__stream);
              } while (pcVar11 != (char *)0x0);
            }
LAB_001036cf:
            if (uVar6 != 0) {
              printf("WARNING: %d (out of %d) input files could not be read\n",(ulong)uVar6,
                     local_530);
            }
            if (uVar15 != 0) {
              printf("WARNING: %d (out of %d) computed checksums did not match\n",(ulong)uVar15,
                     (ulong)uVar14);
            }
            fclose(__stream);
            uVar14 = (uint)(uVar15 != 0 || uVar6 != 0);
          }
        }
        else {
          uVar14 = 0;
          if (2 < argc) {
            uVar16 = 2;
            uVar14 = 0;
            do {
              pcVar9 = argv[uVar16];
              iVar4 = generic_wrapper(pmVar8,pcVar9,(uchar *)(acStack_439 + 1));
              uVar6 = 1;
              if (iVar4 == 0) {
                uVar1 = mbedtls_md_get_size(pmVar8);
                if (uVar1 != '\0') {
                  uVar13 = 0;
                  do {
                    printf("%02x",(ulong)(byte)acStack_439[uVar13 + 1]);
                    uVar13 = uVar13 + 1;
                    bVar2 = mbedtls_md_get_size(pmVar8);
                  } while (uVar13 < bVar2);
                }
                uVar6 = 0;
                printf("  %s\n",pcVar9);
              }
              uVar14 = uVar14 | uVar6;
              uVar16 = uVar16 + 1;
            } while (uVar16 != (uint)argc);
          }
        }
        mbedtls_md_free(&local_520);
        return uVar14;
      }
      main_cold_1();
    }
  }
  return 1;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret, i;
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;

    mbedtls_md_init( &md_ctx );

    if( argc == 1 )
    {
        const int *list;

        mbedtls_printf( "print mode:  generic_sum <mbedtls_md> <file> <file> ...\n" );
        mbedtls_printf( "check mode:  generic_sum <mbedtls_md> -c <checksum file>\n" );

        mbedtls_printf( "\nAvailable message digests:\n" );
        list = mbedtls_md_list();
        while( *list )
        {
            md_info = mbedtls_md_info_from_type( *list );
            mbedtls_printf( "  %s\n", mbedtls_md_get_name( md_info ) );
            list++;
        }

#if defined(_WIN32)
        mbedtls_printf( "\n  Press Enter to exit this program.\n" );
        fflush( stdout ); getchar();
#endif

        return( 1 );
    }

    /*
     * Read the MD from the command line
     */
    md_info = mbedtls_md_info_from_string( argv[1] );
    if( md_info == NULL )
    {
        mbedtls_fprintf( stderr, "Message Digest '%s' not found\n", argv[1] );
        return( 1 );
    }
    if( mbedtls_md_setup( &md_ctx, md_info, 0 ) )
    {
        mbedtls_fprintf( stderr, "Failed to initialize context.\n" );
        return( 1 );
    }

    ret = 0;
    if( argc == 4 && strcmp( "-c", argv[2] ) == 0 )
    {
        ret |= generic_check( md_info, argv[3] );
        goto exit;
    }

    for( i = 2; i < argc; i++ )
        ret |= generic_print( md_info, argv[i] );

exit:
    mbedtls_md_free( &md_ctx );

    return( ret );
}